

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O0

MemoryReportFormatter * __thiscall
MemoryReporterPluginUnderTest::createMemoryFormatter
          (MemoryReporterPluginUnderTest *this,SimpleString *type)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  MockActualCall *this_00;
  char *value;
  MemoryReportFormatter *this_01;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  SimpleString *local_18;
  SimpleString *type_local;
  MemoryReporterPluginUnderTest *this_local;
  
  local_18 = type;
  type_local = (SimpleString *)this;
  SimpleString::SimpleString(&local_28,"reporter");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"createMemoryFormatter");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,local_48);
  this_00 = (MockActualCall *)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x170))
                      ((long *)CONCAT44(extraout_var,iVar1),this);
  SimpleString::SimpleString(&local_58,"type");
  value = SimpleString::asCharString(local_18);
  MockActualCall::withParameter(this_00,&local_58,value);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  this_01 = (MemoryReportFormatter *)
            operator_new(8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MemoryReporterPluginTest.cpp"
                         ,100);
  MockMemoryReportFormatter::MockMemoryReportFormatter((MockMemoryReportFormatter *)this_01);
  return this_01;
}

Assistant:

MemoryReportFormatter* createMemoryFormatter(const SimpleString& type) _override
    {
        mock("reporter").actualCall("createMemoryFormatter").onObject(this).withParameter("type", type.asCharString());
        return new MockMemoryReportFormatter;
    }